

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeCorrFunc.cpp
# Opt level: O0

void __thiscall OpenMD::TimeCorrFunc<int>::computeFrame(TimeCorrFunc<int> *this,int istep)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  reference pvVar4;
  size_type sVar5;
  uint *puVar6;
  reference pvVar7;
  vector<int,_std::allocator<int>_> *this_00;
  vector<int,_std::allocator<int>_> *pvVar8;
  int in_ESI;
  long *in_RDI;
  int prevIndex_5;
  int prevIndex_4;
  int prevIndex_3;
  int prevIndex_2;
  int prevIndex_1;
  int prevIndex;
  uint index;
  int ibond2;
  int ibond1;
  int isd2;
  int isd1;
  int imol2;
  int imol1;
  Bond *bond;
  StuntDouble *sd;
  Molecule *mol;
  reference in_stack_fffffffffffffdb8;
  reference in_stack_fffffffffffffdc0;
  SelectionSet *in_stack_fffffffffffffdc8;
  uint in_stack_fffffffffffffdd0;
  int in_stack_fffffffffffffdd4;
  reference in_stack_fffffffffffffdd8;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffde0;
  size_type in_stack_fffffffffffffde8;
  reference in_stack_fffffffffffffdf0;
  SelectionEvaluator *in_stack_fffffffffffffdf8;
  uint local_44;
  Bond *local_28;
  StuntDouble *local_20;
  Molecule *local_18;
  
  bVar1 = SelectionEvaluator::isDynamic((SelectionEvaluator *)(in_RDI + 0x54));
  if (bVar1) {
    SelectionEvaluator::evaluate(in_stack_fffffffffffffdf8);
    SelectionManager::setSelectionSet
              ((SelectionManager *)CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0),
               in_stack_fffffffffffffdc8);
    SelectionSet::~SelectionSet((SelectionSet *)0x193254);
    (**(code **)(*in_RDI + 0x38))(in_RDI,in_RDI + 0x19);
  }
  if (((*(byte *)(in_RDI + 0x1a8) & 1) != 0) &&
     (bVar1 = SelectionEvaluator::isDynamic((SelectionEvaluator *)(in_RDI + 0xfe)), bVar1)) {
    SelectionEvaluator::evaluate(in_stack_fffffffffffffdf8);
    SelectionManager::setSelectionSet
              ((SelectionManager *)CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0),
               in_stack_fffffffffffffdc8);
    SelectionSet::~SelectionSet((SelectionSet *)0x19331f);
    (**(code **)(*in_RDI + 0x38))(in_RDI,in_RDI + 0x32);
  }
  if (((*(byte *)((long)in_RDI + 0xd42) & 1) != 0) &&
     ((**(code **)(*in_RDI + 0x50))(in_RDI,in_ESI), (*(byte *)((long)in_RDI + 0xd41) & 1) == 0)) {
    (**(code **)(*in_RDI + 0x58))(in_RDI,in_ESI);
  }
  if ((*(byte *)((long)in_RDI + 0xd43) & 1) != 0) {
    if ((*(byte *)(in_RDI + 5) & 1) != 0) {
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                    *)(in_RDI + 0x1bb),(long)in_ESI);
      SimInfo::getNGlobalMolecules((SimInfo *)in_RDI[0x13]);
      std::vector<int,_std::allocator<int>_>::resize
                (in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8,
                 (value_type_conflict2 *)in_stack_fffffffffffffde0);
    }
    local_18 = SelectionManager::beginSelectedMolecule
                         ((SelectionManager *)
                          CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0),
                          (int *)in_stack_fffffffffffffdc8);
    while (local_18 != (Molecule *)0x0) {
      uVar2 = (**(code **)(*in_RDI + 0x68))(in_RDI,in_ESI,local_18);
      pvVar4 = std::
               vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                             *)(in_RDI + 0x1b5),(long)in_ESI);
      sVar5 = std::vector<int,_std::allocator<int>_>::size(pvVar4);
      if (uVar2 == sVar5) {
        std::
        vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
        ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                      *)(in_RDI + 0x1b5),(long)in_ESI);
        Molecule::getGlobalIndex(local_18);
        std::vector<int,_std::allocator<int>_>::push_back
                  (in_stack_fffffffffffffdc0,(value_type_conflict2 *)in_stack_fffffffffffffdb8);
      }
      else {
        std::
        vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
        ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                      *)(in_RDI + 0x1b5),(long)in_ESI);
        std::vector<int,_std::allocator<int>_>::resize
                  (in_stack_fffffffffffffde0,(size_type)in_stack_fffffffffffffdd8);
        iVar3 = Molecule::getGlobalIndex(local_18);
        pvVar4 = std::
                 vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                               *)(in_RDI + 0x1b5),(long)in_ESI);
        pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](pvVar4,(ulong)uVar2);
        *pvVar7 = iVar3;
      }
      if ((*(byte *)(in_RDI + 5) & 1) != 0) {
        pvVar4 = std::
                 vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                               *)(in_RDI + 0x1bb),(long)in_ESI);
        iVar3 = Molecule::getGlobalIndex(local_18);
        puVar6 = (uint *)std::vector<int,_std::allocator<int>_>::operator[](pvVar4,(long)iVar3);
        *puVar6 = uVar2;
        if (in_ESI == 0) {
          std::
          vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                        *)(in_RDI + 0x1c1),0);
          std::vector<int,_std::allocator<int>_>::push_back
                    ((vector<int,_std::allocator<int>_> *)
                     CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0),
                     (value_type_conflict2 *)in_stack_fffffffffffffdc8);
        }
        else {
          pvVar4 = std::
                   vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                 *)(in_RDI + 0x1bb),(long)(in_ESI + -1));
          iVar3 = Molecule::getGlobalIndex(local_18);
          pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](pvVar4,(long)iVar3);
          iVar3 = *pvVar7;
          if (iVar3 == -1) {
            std::
            vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                          *)(in_RDI + 0x1c1),(long)in_ESI);
            std::vector<int,_std::allocator<int>_>::push_back
                      ((vector<int,_std::allocator<int>_> *)
                       CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0),
                       (value_type_conflict2 *)in_stack_fffffffffffffdc8);
          }
          else {
            std::
            vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                          *)(in_RDI + 0x1c1),(long)in_ESI);
            pvVar4 = std::
                     vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                   *)(in_RDI + 0x1c1),(long)(in_ESI + -1));
            std::vector<int,_std::allocator<int>_>::operator[](pvVar4,(long)iVar3);
            std::vector<int,_std::allocator<int>_>::push_back
                      ((vector<int,_std::allocator<int>_> *)
                       CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0),
                       (value_type_conflict2 *)in_stack_fffffffffffffdc8);
          }
        }
      }
      if ((*(byte *)(in_RDI + 0x1a8) & 1) == 0) {
        (**(code **)(*in_RDI + 0x70))(in_RDI,in_ESI,local_18);
      }
      local_18 = SelectionManager::nextSelectedMolecule
                           ((SelectionManager *)
                            CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0),
                            (int *)in_stack_fffffffffffffdc8);
    }
    if ((*(byte *)(in_RDI + 0x1a8) & 1) != 0) {
      if ((*(byte *)(in_RDI + 5) & 1) != 0) {
        std::
        vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
        ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                      *)(in_RDI + 0x1be),(long)in_ESI);
        SimInfo::getNGlobalMolecules((SimInfo *)in_RDI[0x13]);
        std::vector<int,_std::allocator<int>_>::resize
                  (in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8,
                   (value_type_conflict2 *)in_stack_fffffffffffffde0);
      }
      local_18 = SelectionManager::beginSelectedMolecule
                           ((SelectionManager *)
                            CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0),
                            (int *)in_stack_fffffffffffffdc8);
      while (local_18 != (Molecule *)0x0) {
        if ((*(byte *)((long)in_RDI + 0xd41) & 1) == 0) {
          local_44 = (**(code **)(*in_RDI + 0x70))(in_RDI,in_ESI,local_18);
        }
        else {
          local_44 = (**(code **)(*in_RDI + 0x68))(in_RDI,in_ESI,local_18);
        }
        pvVar4 = std::
                 vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                               *)(in_RDI + 0x1b8),(long)in_ESI);
        sVar5 = std::vector<int,_std::allocator<int>_>::size(pvVar4);
        if (local_44 == sVar5) {
          std::
          vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                        *)(in_RDI + 0x1b8),(long)in_ESI);
          Molecule::getGlobalIndex(local_18);
          std::vector<int,_std::allocator<int>_>::push_back
                    (in_stack_fffffffffffffdc0,(value_type_conflict2 *)in_stack_fffffffffffffdb8);
        }
        else {
          std::
          vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                        *)(in_RDI + 0x1b8),(long)in_ESI);
          std::vector<int,_std::allocator<int>_>::resize
                    (in_stack_fffffffffffffde0,(size_type)in_stack_fffffffffffffdd8);
          iVar3 = Molecule::getGlobalIndex(local_18);
          pvVar4 = std::
                   vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                 *)(in_RDI + 0x1b8),(long)in_ESI);
          pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](pvVar4,(ulong)local_44);
          *pvVar7 = iVar3;
        }
        if ((*(byte *)(in_RDI + 5) & 1) != 0) {
          pvVar4 = std::
                   vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                 *)(in_RDI + 0x1be),(long)in_ESI);
          iVar3 = Molecule::getGlobalIndex(local_18);
          puVar6 = (uint *)std::vector<int,_std::allocator<int>_>::operator[](pvVar4,(long)iVar3);
          *puVar6 = local_44;
          if (in_ESI == 0) {
            std::
            vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                          *)(in_RDI + 0x1c4),0);
            std::vector<int,_std::allocator<int>_>::push_back
                      ((vector<int,_std::allocator<int>_> *)
                       CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0),
                       (value_type_conflict2 *)in_stack_fffffffffffffdc8);
          }
          else {
            pvVar4 = std::
                     vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                   *)(in_RDI + 0x1be),(long)(in_ESI + -1));
            iVar3 = Molecule::getGlobalIndex(local_18);
            pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](pvVar4,(long)iVar3);
            iVar3 = *pvVar7;
            if (iVar3 == -1) {
              std::
              vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                            *)(in_RDI + 0x1c4),(long)in_ESI);
              std::vector<int,_std::allocator<int>_>::push_back
                        ((vector<int,_std::allocator<int>_> *)
                         CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0),
                         (value_type_conflict2 *)in_stack_fffffffffffffdc8);
            }
            else {
              std::
              vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                            *)(in_RDI + 0x1c4),(long)in_ESI);
              pvVar4 = std::
                       vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                       ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                     *)(in_RDI + 0x1c4),(long)(in_ESI + -1));
              std::vector<int,_std::allocator<int>_>::operator[](pvVar4,(long)iVar3);
              std::vector<int,_std::allocator<int>_>::push_back
                        ((vector<int,_std::allocator<int>_> *)
                         CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0),
                         (value_type_conflict2 *)in_stack_fffffffffffffdc8);
            }
          }
        }
        local_18 = SelectionManager::nextSelectedMolecule
                             ((SelectionManager *)
                              CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0),
                              (int *)in_stack_fffffffffffffdc8);
      }
    }
  }
  if ((*(byte *)((long)in_RDI + 0xd44) & 1) != 0) {
    if ((*(byte *)(in_RDI + 5) & 1) != 0) {
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                    *)(in_RDI + 0x1bb),(long)in_ESI);
      SimInfo::getNGlobalIntegrableObjects((SimInfo *)in_RDI[0x13]);
      std::vector<int,_std::allocator<int>_>::resize
                (in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8,
                 (value_type_conflict2 *)in_stack_fffffffffffffde0);
    }
    local_20 = SelectionManager::beginSelected
                         ((SelectionManager *)
                          CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0),
                          (int *)in_stack_fffffffffffffdc8);
    while (local_20 != (StuntDouble *)0x0) {
      uVar2 = (**(code **)(*in_RDI + 0x78))(in_RDI,in_ESI,local_20);
      pvVar4 = std::
               vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                             *)(in_RDI + 0x1b5),(long)in_ESI);
      sVar5 = std::vector<int,_std::allocator<int>_>::size(pvVar4);
      if (uVar2 == sVar5) {
        std::
        vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
        ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                      *)(in_RDI + 0x1b5),(long)in_ESI);
        StuntDouble::getGlobalIndex(local_20);
        std::vector<int,_std::allocator<int>_>::push_back
                  (in_stack_fffffffffffffdc0,(value_type_conflict2 *)in_stack_fffffffffffffdb8);
      }
      else {
        std::
        vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
        ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                      *)(in_RDI + 0x1b5),(long)in_ESI);
        std::vector<int,_std::allocator<int>_>::resize
                  (in_stack_fffffffffffffde0,(size_type)in_stack_fffffffffffffdd8);
        iVar3 = StuntDouble::getGlobalIndex(local_20);
        pvVar4 = std::
                 vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                               *)(in_RDI + 0x1b5),(long)in_ESI);
        pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](pvVar4,(ulong)uVar2);
        *pvVar7 = iVar3;
      }
      if ((*(byte *)(in_RDI + 5) & 1) != 0) {
        pvVar4 = std::
                 vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                               *)(in_RDI + 0x1bb),(long)in_ESI);
        iVar3 = StuntDouble::getGlobalIndex(local_20);
        puVar6 = (uint *)std::vector<int,_std::allocator<int>_>::operator[](pvVar4,(long)iVar3);
        *puVar6 = uVar2;
        if (in_ESI == 0) {
          std::
          vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                        *)(in_RDI + 0x1c1),0);
          std::vector<int,_std::allocator<int>_>::push_back
                    ((vector<int,_std::allocator<int>_> *)
                     CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0),
                     (value_type_conflict2 *)in_stack_fffffffffffffdc8);
        }
        else {
          pvVar4 = std::
                   vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                 *)(in_RDI + 0x1bb),(long)(in_ESI + -1));
          iVar3 = StuntDouble::getGlobalIndex(local_20);
          pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](pvVar4,(long)iVar3);
          iVar3 = *pvVar7;
          if (iVar3 == -1) {
            std::
            vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                          *)(in_RDI + 0x1c1),(long)in_ESI);
            std::vector<int,_std::allocator<int>_>::push_back
                      ((vector<int,_std::allocator<int>_> *)
                       CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0),
                       (value_type_conflict2 *)in_stack_fffffffffffffdc8);
          }
          else {
            std::
            vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                          *)(in_RDI + 0x1c1),(long)in_ESI);
            pvVar4 = std::
                     vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                   *)(in_RDI + 0x1c1),(long)(in_ESI + -1));
            std::vector<int,_std::allocator<int>_>::operator[](pvVar4,(long)iVar3);
            std::vector<int,_std::allocator<int>_>::push_back
                      ((vector<int,_std::allocator<int>_> *)
                       CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0),
                       (value_type_conflict2 *)in_stack_fffffffffffffdc8);
          }
        }
      }
      if ((*(byte *)(in_RDI + 0x1a8) & 1) == 0) {
        (**(code **)(*in_RDI + 0x80))(in_RDI,in_ESI,local_20);
      }
      local_20 = SelectionManager::nextSelected
                           ((SelectionManager *)
                            CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0),
                            (int *)in_stack_fffffffffffffdc8);
    }
    if ((*(byte *)(in_RDI + 0x1a8) & 1) != 0) {
      if ((*(byte *)(in_RDI + 5) & 1) != 0) {
        std::
        vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
        ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                      *)(in_RDI + 0x1be),(long)in_ESI);
        SimInfo::getNGlobalIntegrableObjects((SimInfo *)in_RDI[0x13]);
        std::vector<int,_std::allocator<int>_>::resize
                  (in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8,
                   (value_type_conflict2 *)in_stack_fffffffffffffde0);
      }
      local_20 = SelectionManager::beginSelected
                           ((SelectionManager *)
                            CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0),
                            (int *)in_stack_fffffffffffffdc8);
      while (local_20 != (StuntDouble *)0x0) {
        if ((*(byte *)((long)in_RDI + 0xd41) & 1) == 0) {
          local_44 = (**(code **)(*in_RDI + 0x80))(in_RDI,in_ESI,local_20);
        }
        else {
          local_44 = (**(code **)(*in_RDI + 0x78))(in_RDI,in_ESI,local_20);
        }
        pvVar4 = std::
                 vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                               *)(in_RDI + 0x1b8),(long)in_ESI);
        sVar5 = std::vector<int,_std::allocator<int>_>::size(pvVar4);
        if (local_44 == sVar5) {
          std::
          vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                        *)(in_RDI + 0x1b8),(long)in_ESI);
          StuntDouble::getGlobalIndex(local_20);
          std::vector<int,_std::allocator<int>_>::push_back
                    (in_stack_fffffffffffffdc0,(value_type_conflict2 *)in_stack_fffffffffffffdb8);
        }
        else {
          std::
          vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                        *)(in_RDI + 0x1b8),(long)in_ESI);
          std::vector<int,_std::allocator<int>_>::resize
                    (in_stack_fffffffffffffde0,(size_type)in_stack_fffffffffffffdd8);
          iVar3 = StuntDouble::getGlobalIndex(local_20);
          pvVar4 = std::
                   vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                 *)(in_RDI + 0x1b8),(long)in_ESI);
          pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](pvVar4,(ulong)local_44);
          *pvVar7 = iVar3;
        }
        if ((*(byte *)(in_RDI + 5) & 1) != 0) {
          pvVar4 = std::
                   vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                 *)(in_RDI + 0x1be),(long)in_ESI);
          iVar3 = StuntDouble::getGlobalIndex(local_20);
          puVar6 = (uint *)std::vector<int,_std::allocator<int>_>::operator[](pvVar4,(long)iVar3);
          *puVar6 = local_44;
          if (in_ESI == 0) {
            std::
            vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                          *)(in_RDI + 0x1c4),0);
            std::vector<int,_std::allocator<int>_>::push_back
                      ((vector<int,_std::allocator<int>_> *)
                       CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0),
                       (value_type_conflict2 *)in_stack_fffffffffffffdc8);
          }
          else {
            pvVar4 = std::
                     vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                   *)(in_RDI + 0x1be),(long)(in_ESI + -1));
            iVar3 = StuntDouble::getGlobalIndex(local_20);
            pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](pvVar4,(long)iVar3);
            iVar3 = *pvVar7;
            if (iVar3 == -1) {
              std::
              vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                            *)(in_RDI + 0x1c4),(long)in_ESI);
              std::vector<int,_std::allocator<int>_>::push_back
                        ((vector<int,_std::allocator<int>_> *)
                         CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0),
                         (value_type_conflict2 *)in_stack_fffffffffffffdc8);
            }
            else {
              std::
              vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                            *)(in_RDI + 0x1c4),(long)in_ESI);
              pvVar4 = std::
                       vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                       ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                     *)(in_RDI + 0x1c4),(long)(in_ESI + -1));
              std::vector<int,_std::allocator<int>_>::operator[](pvVar4,(long)iVar3);
              std::vector<int,_std::allocator<int>_>::push_back
                        ((vector<int,_std::allocator<int>_> *)
                         CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0),
                         (value_type_conflict2 *)in_stack_fffffffffffffdc8);
            }
          }
        }
        local_20 = SelectionManager::nextSelected
                             ((SelectionManager *)
                              CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0),
                              (int *)in_stack_fffffffffffffdc8);
      }
    }
  }
  if ((*(byte *)((long)in_RDI + 0xd46) & 1) != 0) {
    if ((*(byte *)(in_RDI + 5) & 1) != 0) {
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                    *)(in_RDI + 0x1bb),(long)in_ESI);
      SimInfo::getNGlobalBonds((SimInfo *)in_RDI[0x13]);
      std::vector<int,_std::allocator<int>_>::resize
                (in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8,
                 (value_type_conflict2 *)in_stack_fffffffffffffde0);
    }
    local_28 = SelectionManager::beginSelectedBond
                         ((SelectionManager *)
                          CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0),
                          (int *)in_stack_fffffffffffffdc8);
    while (local_28 != (Bond *)0x0) {
      uVar2 = (**(code **)(*in_RDI + 0x88))(in_RDI,in_ESI,local_28);
      pvVar4 = std::
               vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                             *)(in_RDI + 0x1b5),(long)in_ESI);
      sVar5 = std::vector<int,_std::allocator<int>_>::size(pvVar4);
      if (uVar2 == sVar5) {
        std::
        vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
        ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                      *)(in_RDI + 0x1b5),(long)in_ESI);
        ShortRangeInteraction::getGlobalIndex(&local_28->super_ShortRangeInteraction);
        std::vector<int,_std::allocator<int>_>::push_back
                  (in_stack_fffffffffffffdc0,(value_type_conflict2 *)in_stack_fffffffffffffdb8);
      }
      else {
        std::
        vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
        ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                      *)(in_RDI + 0x1b5),(long)in_ESI);
        std::vector<int,_std::allocator<int>_>::resize
                  (in_stack_fffffffffffffde0,(size_type)in_stack_fffffffffffffdd8);
        iVar3 = ShortRangeInteraction::getGlobalIndex(&local_28->super_ShortRangeInteraction);
        pvVar4 = std::
                 vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                               *)(in_RDI + 0x1b5),(long)in_ESI);
        pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](pvVar4,(ulong)uVar2);
        *pvVar7 = iVar3;
      }
      if ((*(byte *)(in_RDI + 5) & 1) != 0) {
        pvVar4 = std::
                 vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                               *)(in_RDI + 0x1bb),(long)in_ESI);
        iVar3 = ShortRangeInteraction::getGlobalIndex(&local_28->super_ShortRangeInteraction);
        puVar6 = (uint *)std::vector<int,_std::allocator<int>_>::operator[](pvVar4,(long)iVar3);
        *puVar6 = uVar2;
        if (in_ESI == 0) {
          std::
          vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                        *)(in_RDI + 0x1c1),0);
          std::vector<int,_std::allocator<int>_>::push_back
                    ((vector<int,_std::allocator<int>_> *)
                     CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0),
                     (value_type_conflict2 *)in_stack_fffffffffffffdc8);
        }
        else {
          pvVar4 = std::
                   vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                 *)(in_RDI + 0x1bb),(long)(in_ESI + -1));
          iVar3 = ShortRangeInteraction::getGlobalIndex(&local_28->super_ShortRangeInteraction);
          pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](pvVar4,(long)iVar3);
          iVar3 = *pvVar7;
          if (iVar3 == -1) {
            std::
            vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                          *)(in_RDI + 0x1c1),(long)in_ESI);
            std::vector<int,_std::allocator<int>_>::push_back
                      ((vector<int,_std::allocator<int>_> *)
                       CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0),
                       (value_type_conflict2 *)in_stack_fffffffffffffdc8);
          }
          else {
            in_stack_fffffffffffffdf0 =
                 std::
                 vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                               *)(in_RDI + 0x1c1),(long)in_ESI);
            pvVar4 = std::
                     vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                   *)(in_RDI + 0x1c1),(long)(in_ESI + -1));
            std::vector<int,_std::allocator<int>_>::operator[](pvVar4,(long)iVar3);
            std::vector<int,_std::allocator<int>_>::push_back
                      ((vector<int,_std::allocator<int>_> *)
                       CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0),
                       (value_type_conflict2 *)in_stack_fffffffffffffdc8);
          }
        }
      }
      if ((*(byte *)(in_RDI + 0x1a8) & 1) == 0) {
        (**(code **)(*in_RDI + 0x90))(in_RDI,in_ESI,local_28);
      }
      local_28 = SelectionManager::nextSelectedBond
                           ((SelectionManager *)
                            CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0),
                            (int *)in_stack_fffffffffffffdc8);
    }
    if ((*(byte *)(in_RDI + 0x1a8) & 1) != 0) {
      if ((*(byte *)(in_RDI + 5) & 1) != 0) {
        pvVar4 = std::
                 vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                               *)(in_RDI + 0x1be),(long)in_ESI);
        SimInfo::getNGlobalBonds((SimInfo *)in_RDI[0x13]);
        std::vector<int,_std::allocator<int>_>::resize
                  (in_stack_fffffffffffffdf0,(size_type)pvVar4,
                   (value_type_conflict2 *)in_stack_fffffffffffffde0);
      }
      local_28 = SelectionManager::beginSelectedBond
                           ((SelectionManager *)
                            CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0),
                            (int *)in_stack_fffffffffffffdc8);
      while (local_28 != (Bond *)0x0) {
        if ((*(byte *)((long)in_RDI + 0xd41) & 1) == 0) {
          local_44 = (**(code **)(*in_RDI + 0x90))(in_RDI,in_ESI,local_28);
        }
        else {
          local_44 = (**(code **)(*in_RDI + 0x88))(in_RDI,in_ESI,local_28);
        }
        this_00 = (vector<int,_std::allocator<int>_> *)(ulong)local_44;
        pvVar4 = std::
                 vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                               *)(in_RDI + 0x1b8),(long)in_ESI);
        pvVar8 = (vector<int,_std::allocator<int>_> *)
                 std::vector<int,_std::allocator<int>_>::size(pvVar4);
        if (this_00 == pvVar8) {
          in_stack_fffffffffffffdd8 =
               std::
               vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                             *)(in_RDI + 0x1b8),(long)in_ESI);
          ShortRangeInteraction::getGlobalIndex(&local_28->super_ShortRangeInteraction);
          std::vector<int,_std::allocator<int>_>::push_back
                    (in_stack_fffffffffffffdc0,(value_type_conflict2 *)in_stack_fffffffffffffdb8);
        }
        else {
          std::
          vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                        *)(in_RDI + 0x1b8),(long)in_ESI);
          std::vector<int,_std::allocator<int>_>::resize
                    (this_00,(size_type)in_stack_fffffffffffffdd8);
          in_stack_fffffffffffffdd4 =
               ShortRangeInteraction::getGlobalIndex(&local_28->super_ShortRangeInteraction);
          pvVar4 = std::
                   vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                 *)(in_RDI + 0x1b8),(long)in_ESI);
          pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](pvVar4,(ulong)local_44);
          *pvVar7 = in_stack_fffffffffffffdd4;
        }
        if ((*(byte *)(in_RDI + 5) & 1) != 0) {
          in_stack_fffffffffffffdc8 =
               (SelectionSet *)
               std::
               vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                             *)(in_RDI + 0x1be),(long)in_ESI);
          iVar3 = ShortRangeInteraction::getGlobalIndex(&local_28->super_ShortRangeInteraction);
          puVar6 = (uint *)std::vector<int,_std::allocator<int>_>::operator[]
                                     ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffdc8
                                      ,(long)iVar3);
          *puVar6 = local_44;
          if (in_ESI == 0) {
            std::
            vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                          *)(in_RDI + 0x1c4),0);
            std::vector<int,_std::allocator<int>_>::push_back
                      ((vector<int,_std::allocator<int>_> *)
                       CONCAT44(in_stack_fffffffffffffdd4,local_44),
                       (value_type_conflict2 *)in_stack_fffffffffffffdc8);
            in_stack_fffffffffffffdd0 = local_44;
          }
          else {
            in_stack_fffffffffffffdc0 =
                 std::
                 vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                               *)(in_RDI + 0x1be),(long)(in_ESI + -1));
            iVar3 = ShortRangeInteraction::getGlobalIndex(&local_28->super_ShortRangeInteraction);
            pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                               (in_stack_fffffffffffffdc0,(long)iVar3);
            iVar3 = *pvVar7;
            if (iVar3 == -1) {
              std::
              vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                            *)(in_RDI + 0x1c4),(long)in_ESI);
              std::vector<int,_std::allocator<int>_>::push_back
                        ((vector<int,_std::allocator<int>_> *)
                         CONCAT44(in_stack_fffffffffffffdd4,local_44),
                         (value_type_conflict2 *)in_stack_fffffffffffffdc8);
              in_stack_fffffffffffffdd0 = local_44;
            }
            else {
              in_stack_fffffffffffffdb8 =
                   std::
                   vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                 *)(in_RDI + 0x1c4),(long)in_ESI);
              pvVar4 = std::
                       vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                       ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                     *)(in_RDI + 0x1c4),(long)(in_ESI + -1));
              std::vector<int,_std::allocator<int>_>::operator[](pvVar4,(long)iVar3);
              std::vector<int,_std::allocator<int>_>::push_back
                        ((vector<int,_std::allocator<int>_> *)
                         CONCAT44(in_stack_fffffffffffffdd4,local_44),
                         (value_type_conflict2 *)in_stack_fffffffffffffdc8);
              in_stack_fffffffffffffdd0 = local_44;
            }
          }
        }
        local_28 = SelectionManager::nextSelectedBond
                             ((SelectionManager *)
                              CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0),
                              (int *)in_stack_fffffffffffffdc8);
      }
    }
  }
  return;
}

Assistant:

void TimeCorrFunc<T>::computeFrame(int istep) {
    Molecule* mol;
    StuntDouble* sd;
    Bond* bond;
    int imol1, imol2, isd1, isd2, ibond1, ibond2;
    unsigned int index;

    if (evaluator1_.isDynamic()) {
      seleMan1_.setSelectionSet(evaluator1_.evaluate());
      validateSelection(seleMan1_);
    }

    if (uniqueSelections_ && evaluator2_.isDynamic()) {
      seleMan2_.setSelectionSet(evaluator2_.evaluate());
      validateSelection(seleMan2_);
    }

    if (doSystemProperties_) {
      computeProperty1(istep);
      if (!autoCorrFunc_) computeProperty2(istep);
    }

    if (doMolecularProperties_) {
      // Map of molecular global IDs to selections
      if (selectionModeRestart_) 
	GIDtoSele1_[istep].resize(info_->getNGlobalMolecules(), -1);

      for (mol = seleMan1_.beginSelectedMolecule(imol1); mol != NULL;
           mol = seleMan1_.nextSelectedMolecule(imol1)) {
        index = computeProperty1(istep, mol);

        if (index == sele1ToIndex_[istep].size()) {
          sele1ToIndex_[istep].push_back(mol->getGlobalIndex());
        } else {
          sele1ToIndex_[istep].resize(index + 1);
          sele1ToIndex_[istep][index] = mol->getGlobalIndex();
        }
	if (selectionModeRestart_) {
	  GIDtoSele1_[istep][mol->getGlobalIndex()] = index;
	  
	  if (istep == 0) {
	    selection1StartFrame_[istep].push_back(istep);
	  } else {
	    int prevIndex = GIDtoSele1_[istep-1][mol->getGlobalIndex()];
	    if (prevIndex == -1)
	      selection1StartFrame_[istep].push_back(istep);
	    else
	      selection1StartFrame_[istep].push_back(selection1StartFrame_[istep-1][prevIndex]);
	  }
	}

        if (!uniqueSelections_) { index = computeProperty2(istep, mol); }
      }

      if (uniqueSelections_) {
	// Map of molecular global IDs to selections
	if (selectionModeRestart_) 	  
	  GIDtoSele2_[istep].resize(info_->getNGlobalMolecules(), -1);

        for (mol = seleMan2_.beginSelectedMolecule(imol2); mol != NULL;
             mol = seleMan2_.nextSelectedMolecule(imol2)) {
          if (autoCorrFunc_) {
            index = computeProperty1(istep, mol);
          } else {
            index = computeProperty2(istep, mol);
          }
          if (index == sele2ToIndex_[istep].size()) {
            sele2ToIndex_[istep].push_back(mol->getGlobalIndex());
          } else {
            sele2ToIndex_[istep].resize(index + 1);
            sele2ToIndex_[istep][index] = mol->getGlobalIndex();
          }
	  if (selectionModeRestart_) {
	    
	    GIDtoSele2_[istep][mol->getGlobalIndex()] = index;
	    if (istep == 0) {
	      selection2StartFrame_[istep].push_back(istep);
	    } else {
	      int prevIndex = GIDtoSele2_[istep-1][mol->getGlobalIndex()];
	      if (prevIndex == -1)
		selection2StartFrame_[istep].push_back(istep);
	      else 	      
		selection2StartFrame_[istep].push_back(selection2StartFrame_[istep-1][prevIndex]);
	    }
	  }	  
        }
      }
    }

    if (doObjectProperties_) {
      // Map of StuntDouble global IDs to selections
      if (selectionModeRestart_)	
	GIDtoSele1_[istep].resize(info_->getNGlobalIntegrableObjects(), -1);
      
      for (sd = seleMan1_.beginSelected(isd1); sd != NULL;
           sd = seleMan1_.nextSelected(isd1)) {
        index = computeProperty1(istep, sd);

        if (index == sele1ToIndex_[istep].size()) {
          sele1ToIndex_[istep].push_back(sd->getGlobalIndex());
        } else {
          sele1ToIndex_[istep].resize(index + 1);
          sele1ToIndex_[istep][index] = sd->getGlobalIndex();
        }

	if (selectionModeRestart_) {

	  GIDtoSele1_[istep][sd->getGlobalIndex()] = index;
	  if (istep == 0) {
	    selection1StartFrame_[istep].push_back(istep);
	  } else {
	    int prevIndex = GIDtoSele1_[istep-1][sd->getGlobalIndex()];
	    if (prevIndex == -1)
	      selection1StartFrame_[istep].push_back(istep);
	    else
	      selection1StartFrame_[istep].push_back(selection1StartFrame_[istep-1][prevIndex]);
	  }
	}

        if (!uniqueSelections_) { index = computeProperty2(istep, sd); }
      }

      if (uniqueSelections_) {
	// Map of StuntDouble global IDs to selections
	if (selectionModeRestart_)
	  GIDtoSele2_[istep].resize(info_->getNGlobalIntegrableObjects(), -1);
	
        for (sd = seleMan2_.beginSelected(isd2); sd != NULL;
             sd = seleMan2_.nextSelected(isd2)) {
          if (autoCorrFunc_) {
            index = computeProperty1(istep, sd);
          } else {
            index = computeProperty2(istep, sd);
          }
          if (index == sele2ToIndex_[istep].size()) {
            sele2ToIndex_[istep].push_back(sd->getGlobalIndex());
          } else {
            sele2ToIndex_[istep].resize(index + 1);
            sele2ToIndex_[istep][index] = sd->getGlobalIndex();
          }
	  if (selectionModeRestart_) {

	    GIDtoSele2_[istep][sd->getGlobalIndex()] = index;
	    if (istep == 0) {
	      selection2StartFrame_[istep].push_back(istep);
	    } else {
	      int prevIndex = GIDtoSele2_[istep-1][sd->getGlobalIndex()];
	      if (prevIndex == -1)
		selection2StartFrame_[istep].push_back(istep);
	      else
		selection2StartFrame_[istep].push_back(selection2StartFrame_[istep-1][prevIndex]);
	    }
	  }
        }
      }
    }

    if (doBondProperties_) {
      // Map of bond global IDs to selections
      if (selectionModeRestart_) 
	GIDtoSele1_[istep].resize(info_->getNGlobalBonds(), -1);

      for (bond = seleMan1_.beginSelectedBond(ibond1); bond != NULL;
           bond = seleMan1_.nextSelectedBond(ibond1)) {
        index = computeProperty1(istep, bond);

        if (index == sele1ToIndex_[istep].size()) {
          sele1ToIndex_[istep].push_back(bond->getGlobalIndex());
        } else {
          sele1ToIndex_[istep].resize(index + 1);
          sele1ToIndex_[istep][index] = bond->getGlobalIndex();
        }

	if (selectionModeRestart_) {
	  
	  GIDtoSele1_[istep][bond->getGlobalIndex()] = index;
	  if (istep == 0) {
	    selection1StartFrame_[istep].push_back(istep);
	  } else {
	    int prevIndex = GIDtoSele1_[istep-1][bond->getGlobalIndex()];
	    if (prevIndex == -1)
	      selection1StartFrame_[istep].push_back(istep);
	    else
	      selection1StartFrame_[istep].push_back(selection1StartFrame_[istep-1][prevIndex]);
	  }
	}
	
        if (!uniqueSelections_) { index = computeProperty2(istep, bond); }
      }

      if (uniqueSelections_) {
	// Map of bond global IDs to selections
	if (selectionModeRestart_) 	 
	  GIDtoSele2_[istep].resize(info_->getNGlobalBonds(), -1);

        for (bond = seleMan2_.beginSelectedBond(ibond2); bond != NULL;
             bond = seleMan2_.nextSelectedBond(ibond2)) {
          if (autoCorrFunc_) {
            index = computeProperty1(istep, bond);
          } else {
            index = computeProperty2(istep, bond);
          }
          if (index == sele2ToIndex_[istep].size()) {
            sele2ToIndex_[istep].push_back(bond->getGlobalIndex());
          } else {
            sele2ToIndex_[istep].resize(index + 1);
            sele2ToIndex_[istep][index] = bond->getGlobalIndex();
          }
	  if (selectionModeRestart_) {

	    GIDtoSele2_[istep][bond->getGlobalIndex()] = index;
	    if (istep == 0) {
	      selection2StartFrame_[istep].push_back(istep);
	    } else {
	      int prevIndex = GIDtoSele2_[istep-1][bond->getGlobalIndex()];
	      if (prevIndex == -1)
		selection2StartFrame_[istep].push_back(istep);
	      else	      
		selection2StartFrame_[istep].push_back(selection2StartFrame_[istep-1][prevIndex]);
	    }
	  }
        }
      }
    }
  }